

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitStructSet(OptimizeInstructions *this,StructSet *curr)

{
  bool bVar1;
  uint bytes;
  const_reference this_00;
  byte local_51;
  bool local_41;
  HeapType local_38;
  Struct *local_30;
  FieldList *fields;
  HeapType heapType;
  StructSet *curr_local;
  OptimizeInstructions *this_local;
  
  skipNonNullCast(this,&curr->ref,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)curr,&curr->ref);
  if (!bVar1) {
    heapType.id._4_4_ = 1;
    bVar1 = wasm::Type::operator!=(&curr->ref->type,(BasicType *)((long)&heapType.id + 4));
    local_41 = false;
    if (bVar1) {
      local_41 = wasm::Type::isInteger(&curr->value->type);
    }
    if (local_41 != false) {
      fields = (FieldList *)wasm::Type::getHeapType(&curr->ref->type);
      bVar1 = HeapType::isStruct((HeapType *)&fields);
      if (bVar1) {
        local_30 = HeapType::getStruct((HeapType *)&fields);
        this_00 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                            (&local_30->fields,(ulong)curr->index);
        bytes = Field::getByteSize(this_00);
        optimizeStoredValue(this,&curr->value,bytes);
      }
    }
    local_51 = 0;
    if (curr->order == AcqRel) {
      bVar1 = wasm::Type::isRef(&curr->ref->type);
      local_51 = 0;
      if (bVar1) {
        local_38 = wasm::Type::getHeapType(&curr->ref->type);
        bVar1 = HeapType::isShared(&local_38);
        local_51 = bVar1 ^ 0xff;
      }
    }
    if ((local_51 & 1) != 0) {
      curr->order = Unordered;
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->ref->type != Type::unreachable && curr->value->type.isInteger()) {
      // We must avoid the case of a null type.
      auto heapType = curr->ref->type.getHeapType();
      if (heapType.isStruct()) {
        const auto& fields = heapType.getStruct().fields;
        optimizeStoredValue(curr->value, fields[curr->index].getByteSize());
      }
    }

    // Relax release stores of unshared fields to unordered because they cannot
    // synchronize with other threads.
    if (curr->order == MemoryOrder::AcqRel && curr->ref->type.isRef() &&
        !curr->ref->type.getHeapType().isShared()) {
      curr->order = MemoryOrder::Unordered;
    }
  }